

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O3

_Bool find_nearby_grid(chunk_conflict *c,loc_conflict *grid,loc_conflict centre,wchar_t yd,
                      wchar_t xd)

{
  loc grid_00;
  _Bool _Var1;
  _Bool _Var2;
  loc_conflict top_left;
  loc_conflict bottom_right;
  int *state;
  
  top_left = loc(centre.x - xd,centre.y - yd);
  bottom_right = loc(xd + centre.x,centre.y + yd);
  state = cave_find_init(top_left,bottom_right);
  do {
    _Var1 = cave_find_get_grid(grid,state);
    if (!_Var1) break;
    grid_00.x = grid->x;
    grid_00.y = grid->y;
    _Var2 = square_in_bounds_fully(c,grid_00);
  } while (!_Var2);
  mem_free(state);
  return _Var1;
}

Assistant:

bool find_nearby_grid(struct chunk *c, struct loc *grid, struct loc centre,
	int yd, int xd)
{
	struct loc top_left = loc(centre.x - xd, centre.y - yd);
	struct loc bottom_right = loc(centre.x + xd, centre.y + yd);
	return cave_find_in_range(c, grid, top_left, bottom_right,
		square_in_bounds_fully);
}